

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<phmap::parallel_flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>,void>
               (parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>
                *container,ostream *os)

{
  anon_union_8_1_a8a14541_for_iterator_1 value;
  long lVar1;
  const_iterator __begin0;
  char local_59;
  iterator local_58;
  
  local_58.inner_._0_1_ = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_58,1);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::begin((const_iterator *)&local_58,
          (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
           *)container);
  if (CONCAT71(local_58.inner_._1_7_,local_58.inner_._0_1_) != 0) {
    lVar1 = 0;
    do {
      value = local_58.it_.field_1;
      if (lVar1 != 0) {
        local_59 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_59,1);
        if (lVar1 == 0x20) {
          std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
          goto LAB_0014d796;
        }
      }
      local_59 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_59,1);
      PrintTo<int_const,phmap::priv::NonStandardLayout>
                ((pair<const_int,_phmap::priv::NonStandardLayout> *)value.slot_,os);
      lVar1 = lVar1 + 1;
      phmap::priv::
      parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
      ::iterator::operator++(&local_58);
    } while (CONCAT71(local_58.inner_._1_7_,local_58.inner_._0_1_) != 0);
    if (lVar1 != 0) {
LAB_0014d796:
      local_58.inner_._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_58,1);
    }
  }
  local_58.inner_._0_1_ = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_58,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }